

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CallOnce.h
# Opt level: O0

void axl::sl::callOnce<axl::sl::ConstructSingleton<axl::err::ErrorMgr>,unsigned_char*>
               (undefined8 param_1,int32_t *param_2)

{
  int32_t iVar1;
  void *in_stack_00000008;
  int32_t value;
  ConstructSingleton<axl::err::ErrorMgr> *in_stack_00000010;
  int32_t *local_18;
  
  local_18 = param_2;
  if (param_2 == (int32_t *)0x0) {
    local_18 = &callOnce<axl::sl::ConstructSingleton<axl::err::ErrorMgr>,_unsigned_char_*>::
                defaultFlag;
  }
  if (*local_18 != 2) {
    if ((*local_18 == 0) && (iVar1 = sys::atomicCmpXchg(local_18,0,1), iVar1 == 0)) {
      ConstructSingleton<axl::err::ErrorMgr>::operator()(in_stack_00000010,in_stack_00000008);
      sys::atomicXchg(local_18,2);
    }
    else {
      do {
        sys::yieldProcessor();
      } while (*local_18 != 2);
    }
  }
  return;
}

Assistant:

void
callOnce(
	Functor functor,
	Argument argument,
	volatile int32_t* flag = NULL
) {
	enum OnceFlag {
		OnceFlag_Uninitialized = 0,
		OnceFlag_Initializing  = 1,
		OnceFlag_Initialized   = 2,
	};

	static volatile int32_t defaultFlag = 0;
	if (!flag)
		flag = &defaultFlag;

	int32_t value = *flag;
	if (value == OnceFlag_Initialized)
		return;

	if (value == OnceFlag_Uninitialized && // try to save one interlocked cmpxcg
		sys::atomicCmpXchg(flag, OnceFlag_Uninitialized, OnceFlag_Initializing) == OnceFlag_Uninitialized) {
		functor(argument);
		sys::atomicXchg(flag, OnceFlag_Initialized);
	} else do {
		sys::yieldProcessor();
	} while (*flag != OnceFlag_Initialized);
}